

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void __thiscall
glslang::TReflectionTraverser::addDereferencedUniform
          (TReflectionTraverser *this,TIntermBinary *topNode)

{
  set<const_TIntermNode_*,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
  *this_00;
  _List_node_header *deref;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  _List_node_base *deref_00;
  char cVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  long *plVar10;
  TIntermSymbol *pTVar11;
  undefined4 extraout_var_00;
  iterator iVar12;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar13;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  TType *pTVar14;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long lVar15;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  int local_9c;
  TString baseName;
  TPoolAllocator *local_58;
  TList<glslang::TIntermBinary_*> derefs;
  
  iVar6 = (*(topNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(topNode);
  plVar10 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0xf0))
                              ((long *)CONCAT44(extraout_var,iVar6));
  cVar3 = (**(code **)(*plVar10 + 0xd8))(plVar10);
  if (((cVar3 != '\0') || (cVar3 = (**(code **)(*plVar10 + 0xe0))(plVar10), cVar3 != '\0')) &&
     (cVar3 = (**(code **)(*plVar10 + 0xe8))(plVar10), cVar3 == '\0')) {
    return;
  }
  pTVar11 = findBase(this,topNode);
  if ((pTVar11 != (TIntermSymbol *)0x0) &&
     (iVar6 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar11),
     (*(uint *)(CONCAT44(extraout_var_00,iVar6) + 8) & 0x7f) - 5 < 2)) {
    this_00 = &this->processedDerefs;
    baseName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)topNode;
    iVar12 = std::
             _Rb_tree<const_TIntermNode_*,_const_TIntermNode_*,_std::_Identity<const_TIntermNode_*>,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
             ::find(&this_00->_M_t,(key_type *)&baseName);
    if ((_Rb_tree_header *)iVar12._M_node ==
        &(this->processedDerefs)._M_t._M_impl.super__Rb_tree_header) {
      iVar6 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x20])(pTVar11);
      if (iVar6 == 0x10) {
        iVar7 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(pTVar11);
        bVar4 = IsAnonymous((TString *)CONCAT44(extraout_var_01,iVar7));
        iVar7 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar11);
        pbVar13 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar7) + 0x28))
                            ((long *)CONCAT44(extraout_var_02,iVar7));
        baseName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        baseName._M_string_length = 0;
        baseName.field_2._M_local_buf[0] = '\0';
        baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
        if (!bVar4) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          _M_assign(&baseName,pbVar13);
        }
        iVar7 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar11);
        iVar8 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar11);
        iVar8 = TIntermediate::getBlockSize((TType *)CONCAT44(extraout_var_04,iVar8));
        iVar7 = addBlockName(this,pbVar13,(TType *)CONCAT44(extraout_var_03,iVar7),iVar8);
        if ((this->reflection->options & EShReflectionAllBlockVariables) != EShReflectionDefault) {
          derefs.
          super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
          super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
          ._M_impl.super__Node_alloc_type.allocator = GetThreadPoolAllocator();
          deref = &derefs.
                   super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                   .
                   super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                   ._M_impl._M_node;
          derefs.
          super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
          super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
          ._M_impl._M_node._M_size = 0;
          derefs.
          super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
          super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
          ._M_impl._M_node.super__List_node_base._M_next = &deref->super__List_node_base;
          derefs.
          super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
          super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
          ._M_impl._M_node.super__List_node_base._M_prev = &deref->super__List_node_base;
          iVar8 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                            (pTVar11);
          iVar9 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])
                            (pTVar11);
          blowUpActiveAggregate
                    (this,(TType *)CONCAT44(extraout_var_05,iVar8),&baseName,&derefs,
                     (const_iterator)deref,0,iVar7,0,-1,0,
                     *(TStorageQualifier *)(CONCAT44(extraout_var_06,iVar9) + 8) & 0x7f,false);
        }
        local_9c = 0;
      }
      else {
        bVar4 = false;
        iVar7 = -1;
        local_9c = -1;
      }
      derefs.
      super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
      super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
      ._M_impl.super__Node_alloc_type.allocator = GetThreadPoolAllocator();
      derefs.
      super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
      super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           &derefs.
            super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
            .
            super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
            ._M_impl._M_node.super__List_node_base;
      derefs.
      super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
      super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
      ._M_impl._M_node._M_size = 0;
      baseName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)topNode;
      derefs.
      super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
      super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           derefs.
           super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
           super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
      while ((TIntermBinary *)baseName._M_dataplus.super_allocator_type.allocator !=
             (TIntermBinary *)0x0) {
        iVar8 = (*(((TIntermBinary *)baseName._M_dataplus.super_allocator_type.allocator)->
                  super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
                  [0x32])(baseName._M_dataplus.super_allocator_type.allocator);
        pTVar14 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_07,iVar8) + 0xf0))
                                     ((long *)CONCAT44(extraout_var_07,iVar8));
        bVar5 = isReflectionGranularity(this,pTVar14);
        if (!bVar5) {
          std::__cxx11::
          list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>::
          push_front(&derefs.
                      super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                     ,(value_type *)&baseName);
          local_58 = baseName._M_dataplus.super_allocator_type.allocator;
          std::
          _Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
          ::_M_insert_unique<TIntermNode_const*>
                    ((_Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
                      *)this_00,(TIntermNode **)&local_58);
        }
        plVar10 = (long *)(**(code **)((baseName._M_dataplus.super_allocator_type.allocator)->
                                       pageSize + 400))();
        baseName._M_dataplus.super_allocator_type.allocator =
             (TPoolAllocator *)(**(code **)(*plVar10 + 0x40))(plVar10);
      }
      baseName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)pTVar11;
      std::
      _Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
      ::_M_insert_unique<TIntermNode_const*>
                ((_Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
                  *)this_00,(TIntermNode **)&baseName);
      iVar8 = (*(topNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])(topNode);
      pTVar14 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar8) + 0xf0))
                                   ((long *)CONCAT44(extraout_var_08,iVar8));
      bVar5 = isReflectionGranularity(this,pTVar14);
      iVar8 = 0;
      if (bVar5) {
        iVar9 = (*(topNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                  _vptr_TIntermNode[0x32])(topNode);
        cVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar9) + 0x150))
                          ((long *)CONCAT44(extraout_var_09,iVar9));
        if ((cVar3 != '\0') && ((topNode->super_TIntermOperator).op == EOpIndexDirect)) {
          iVar8 = (*(topNode->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x33])(topNode);
          lVar15 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar8) + 0x28))
                             ((long *)CONCAT44(extraout_var_10,iVar8));
          iVar8 = **(int **)(*(long *)(lVar15 + 0xc0) + 8) + 1;
        }
      }
      paVar1 = &baseName.field_2;
      baseName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      baseName._M_string_length = 0;
      baseName.field_2._M_local_buf[0] = '\0';
      baseName._M_dataplus._M_p = (pointer)paVar1;
      if (bVar4 == false) {
        pp_Var2 = (pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode;
        if (iVar6 == 0x10) {
          iVar6 = (*pp_Var2[0x1e])(pTVar11);
          pbVar13 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar6) + 0x28))
                              ((long *)CONCAT44(extraout_var_11,iVar6));
        }
        else {
          iVar6 = (*pp_Var2[0x32])(pTVar11);
          pbVar13 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    CONCAT44(extraout_var_12,iVar6);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_assign(&baseName,pbVar13);
      }
      iVar6 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar11);
      deref_00 = derefs.
                 super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                 .
                 super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
      iVar9 = (*(pTVar11->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x21])(pTVar11);
      blowUpActiveAggregate
                (this,(TType *)CONCAT44(extraout_var_13,iVar6),&baseName,&derefs,
                 (const_iterator)deref_00,local_9c,iVar7,iVar8,-1,0,
                 *(TStorageQualifier *)(CONCAT44(extraout_var_14,iVar9) + 8) & 0x7f,true);
    }
  }
  return;
}

Assistant:

void addDereferencedUniform(TIntermBinary* topNode)
    {
        // See if too fine-grained to process (wait to get further down the tree)
        const TType& leftType = topNode->getLeft()->getType();
        if ((leftType.isVector() || leftType.isMatrix()) && ! leftType.isArray())
            return;

        // We have an array or structure or block dereference, see if it's a uniform
        // based dereference (if not, skip it).
        TIntermSymbol* base = findBase(topNode);
        if (! base || ! base->getQualifier().isUniformOrBuffer())
            return;

        // See if we've already processed this (e.g., in the middle of something
        // we did earlier), and if so skip it
        if (processedDerefs.find(topNode) != processedDerefs.end())
            return;

        // Process this uniform dereference

        int offset = -1;
        int blockIndex = -1;
        bool anonymous = false;

        // See if we need to record the block itself
        bool block = base->getBasicType() == EbtBlock;
        if (block) {
            offset = 0;
            anonymous = IsAnonymous(base->getName());

            const TString& blockName = base->getType().getTypeName();
            TString baseName;
            
            if (! anonymous)
                baseName = blockName;

            blockIndex = addBlockName(blockName, base->getType(), intermediate.getBlockSize(base->getType()));

            if (reflection.options & EShReflectionAllBlockVariables) {
                // Use a degenerate (empty) set of dereferences to immediately put as at the end of
                // the dereference change expected by blowUpActiveAggregate.
                TList<TIntermBinary*> derefs;

                // otherwise - if we're not using strict array suffix rules, or this isn't a block so we are
                // expanding root arrays anyway, just start the iteration from the base block type.
                blowUpActiveAggregate(base->getType(), baseName, derefs, derefs.end(), 0, blockIndex, 0, -1, 0,
                                          base->getQualifier().storage, false);
            }
        }

        // Process the dereference chain, backward, accumulating the pieces for later forward traversal.
        // If the topNode is a reflection-granularity-array dereference, don't include that last dereference.
        TList<TIntermBinary*> derefs;
        for (TIntermBinary* visitNode = topNode; visitNode; visitNode = visitNode->getLeft()->getAsBinaryNode()) {
            if (isReflectionGranularity(visitNode->getLeft()->getType()))
                continue;

            derefs.push_front(visitNode);
            processedDerefs.insert(visitNode);
        }
        processedDerefs.insert(base);

        // See if we have a specific array size to stick to while enumerating the explosion of the aggregate
        int arraySize = 0;
        if (isReflectionGranularity(topNode->getLeft()->getType()) && topNode->getLeft()->isArray()) {
            if (topNode->getOp() == EOpIndexDirect)
                arraySize = topNode->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst() + 1;
        }

        // Put the dereference chain together, forward
        TString baseName;
        if (! anonymous) {
            if (block)
                baseName = base->getType().getTypeName();
            else
                baseName = base->getName();
        }
        blowUpActiveAggregate(base->getType(), baseName, derefs, derefs.begin(), offset, blockIndex, arraySize, -1, 0,
                              base->getQualifier().storage, true);
    }